

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

Integer __thiscall
nvim::Nvim::buf_set_virtual_text
          (Nvim *this,Buffer buffer,Integer ns_id,Integer line,Array *chunks,Dictionary *opts)

{
  string local_70;
  Integer res;
  Buffer buffer_local;
  Integer line_local;
  Integer ns_id_local;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  buffer_local = buffer;
  line_local = line;
  ns_id_local = ns_id;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"nvim_buf_set_virtual_text","");
  NvimRPC::
  call<long,long,long,std::vector<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::allocator<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_70,&res,&buffer_local,&ns_id_local,&line_local,chunks,opts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return res;
}

Assistant:

Integer Nvim::buf_set_virtual_text(Buffer buffer, Integer ns_id, Integer line, const Array& chunks, const Dictionary& opts) {
    Integer res;
    client_.call("nvim_buf_set_virtual_text", res, buffer, ns_id, line, chunks, opts);
    return res;
}